

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O2

void __thiscall
QAccessibleLineEdit::replaceText
          (QAccessibleLineEdit *this,int startOffset,int endOffset,QString *text)

{
  QLineEdit *this_00;
  QLineEdit *this_01;
  QString *text_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = lineEdit(this);
  this_01 = lineEdit(this);
  QLineEdit::text((QString *)&QStack_48,this_01);
  text_00 = (QString *)
            QString::replace((longlong)&QStack_48,(long)startOffset,
                             (QString *)(long)(endOffset - startOffset));
  QLineEdit::setText(this_00,text_00);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAccessibleLineEdit::replaceText(int startOffset, int endOffset, const QString &text)
{
    lineEdit()->setText(lineEdit()->text().replace(startOffset, endOffset - startOffset, text));
}